

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<double>>::
initialize<tinyusdz::Animatable<double>>
          (optional<tinyusdz::Animatable<double>> *this,Animatable<double> *value)

{
  if (*this != (optional<tinyusdz::Animatable<double>>)0x1) {
    tinyusdz::Animatable<double>::Animatable((Animatable<double> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<double>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<double>>::initialize(V &&) [T = tinyusdz::Animatable<double>, V = tinyusdz::Animatable<double>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }